

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_add_input_at(wally_tx *tx,uint32_t index,wally_tx_input *input)

{
  wally_tx_witness_stack *pwVar1;
  _Bool _Var2;
  wally_tx_input *pwVar3;
  int iVar4;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  wally_tx_witness_stack *local_78;
  wally_tx_witness_stack *new_pegin_witness;
  uchar *new_inflation_keys_rangeproof;
  uchar *new_issuance_amount_rangeproof;
  uchar *new_inflation_keys;
  uchar *new_issuance_amount;
  uchar *new_script;
  long local_40;
  ulong local_38;
  
  _Var2 = is_valid_tx(tx);
  iVar4 = -2;
  if (_Var2) {
    uVar7 = (ulong)index;
    uVar5 = tx->num_inputs;
    if ((uVar7 <= uVar5) && (_Var2 = is_valid_tx_input(input), _Var2)) {
      pwVar3 = tx->inputs;
      iVar4 = -3;
      if (tx->inputs_allocation_len <= uVar5) {
        pwVar3 = (wally_tx_input *)realloc_array(pwVar3,tx->inputs_allocation_len,uVar5 + 1,0xd0);
        if (pwVar3 == (wally_tx_input *)0x0) {
          return -3;
        }
        clear_and_free(tx->inputs,tx->num_inputs * 0xd0);
        tx->inputs = pwVar3;
        tx->inputs_allocation_len = tx->inputs_allocation_len + 1;
        uVar5 = tx->num_inputs;
      }
      local_38 = uVar7;
      memmove(pwVar3 + uVar7 + 1,pwVar3 + uVar7,(uVar5 - uVar7) * 0xd0);
      new_script = (uchar *)0x0;
      new_issuance_amount = (uchar *)0x0;
      new_inflation_keys = (uchar *)0x0;
      new_issuance_amount_rangeproof = (uchar *)0x0;
      new_inflation_keys_rangeproof = (uchar *)0x0;
      new_pegin_witness = (wally_tx_witness_stack *)0x0;
      local_78 = (wally_tx_witness_stack *)0x0;
      pwVar3 = tx->inputs + uVar7;
      local_40 = uVar7 * 0xd0;
      if (input->witness != (wally_tx_witness_stack *)0x0) {
        wally_tx_witness_stack_clone_alloc(input->witness,&local_78);
      }
      if (input->pegin_witness != (wally_tx_witness_stack *)0x0) {
        wally_tx_witness_stack_clone_alloc(input->pegin_witness,&new_pegin_witness);
      }
      _Var2 = clone_data(&new_script,input->script,input->script_len);
      uVar5 = local_38;
      if ((((_Var2) &&
           (_Var2 = clone_data(&new_issuance_amount,input->issuance_amount,
                               input->issuance_amount_len), _Var2)) &&
          (_Var2 = clone_data(&new_inflation_keys,input->inflation_keys,input->inflation_keys_len),
          _Var2)) &&
         (_Var2 = clone_data(&new_issuance_amount_rangeproof,input->issuance_amount_rangeproof,
                             input->issuance_amount_rangeproof_len), _Var2)) {
        _Var2 = clone_data(&new_inflation_keys_rangeproof,input->inflation_keys_rangeproof,
                           input->inflation_keys_rangeproof_len);
        puVar6 = new_inflation_keys_rangeproof;
        pwVar1 = local_78;
        if ((_Var2) &&
           (local_78 != (wally_tx_witness_stack *)0x0 ||
            input->witness == (wally_tx_witness_stack *)0x0)) {
          memcpy(pwVar3,input,200);
          pwVar3->script = new_script;
          pwVar3->issuance_amount = new_issuance_amount;
          pwVar3->inflation_keys = new_inflation_keys;
          pwVar3->issuance_amount_rangeproof = new_issuance_amount_rangeproof;
          pwVar3->inflation_keys_rangeproof = puVar6;
          pwVar3->pegin_witness = new_pegin_witness;
          pwVar3->witness = pwVar1;
          tx->num_inputs = tx->num_inputs + 1;
          return 0;
        }
      }
      else {
        puVar6 = (uchar *)0x0;
      }
      clear_and_free(new_script,input->script_len);
      clear_and_free(new_issuance_amount,input->issuance_amount_len);
      clear_and_free(new_inflation_keys,input->inflation_keys_len);
      clear_and_free(new_issuance_amount_rangeproof,input->issuance_amount_rangeproof_len);
      clear_and_free(puVar6,input->inflation_keys_rangeproof_len);
      wally_tx_witness_stack_free(new_pegin_witness);
      wally_tx_witness_stack_free(local_78);
      puVar6 = tx->inputs->txhash + local_40;
      memmove(puVar6,puVar6 + 0xd0,(tx->num_inputs - uVar5) * 0xd0);
    }
  }
  return iVar4;
}

Assistant:

int wally_tx_add_input_at(struct wally_tx *tx, uint32_t index,
                          const struct wally_tx_input *input)
{
    if (!is_valid_tx(tx) || index > tx->num_inputs || !is_valid_tx_input(input))
        return WALLY_EINVAL;

    if (tx->num_inputs >= tx->inputs_allocation_len) {
        /* Expand the inputs array */
        struct wally_tx_input *p;
        p = realloc_array(tx->inputs, tx->inputs_allocation_len,
                          tx->num_inputs + 1, sizeof(*tx->inputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->inputs, tx->num_inputs * sizeof(*tx->inputs));
        tx->inputs = p;
        tx->inputs_allocation_len += 1;
    }

    memmove(tx->inputs + index + 1, tx->inputs + index,
            (tx->num_inputs - index) * sizeof(*input));

    if (!clone_input_to(tx->inputs + index, input)) {
        memmove(tx->inputs + index, tx->inputs + index + 1,
                (tx->num_inputs - index) * sizeof(*input)); /* Undo */
        return WALLY_ENOMEM;
    }

    tx->num_inputs += 1;
    return WALLY_OK;
}